

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_value.hpp
# Opt level: O0

value_ptr __thiscall
pstore::diff_dump::
make_index_diff<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>(*)(pstore::database&,bool)>
          (diff_dump *this,czstring name,database *db,revision_number new_revision,
          revision_number old_revision,
          _func_shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_database_ptr_bool
          *get_index)

{
  initializer_list<pstore::dump::object::member> __l;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_ptr vVar1;
  member *local_190;
  allocator<pstore::dump::object::member> local_152;
  undefined1 local_151;
  value_ptr local_150;
  allocator local_139;
  string local_138 [32];
  value_ptr local_118;
  allocator local_101;
  string local_100 [32];
  member *local_e0;
  member local_d8;
  member local_a8;
  iterator local_78;
  size_type local_70;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_68;
  undefined1 local_40 [8];
  revision_restorer _;
  _func_shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_database_ptr_bool
  *get_index_local;
  revision_number old_revision_local;
  revision_number new_revision_local;
  database *db_local;
  czstring name_local;
  
  _._8_8_ = get_index;
  if (old_revision <= new_revision) {
    details::revision_restorer::revision_restorer((revision_restorer *)local_40,db);
    database::sync(db);
    local_151 = 1;
    local_e0 = &local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"name",&local_101);
    dump::make_value((dump *)&local_118,name);
    dump::object::member::member(&local_d8,(string *)local_100,&local_118);
    local_e0 = &local_a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"members",&local_139);
    make_diff<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>(*)(pstore::database&,bool)>
              ((diff_dump *)&local_150,db,old_revision,
               (_func_shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_database_ptr_bool
                *)_._8_8_);
    dump::object::member::member(&local_a8,(string *)local_138,&local_150);
    local_151 = 0;
    local_78 = &local_d8;
    local_70 = 2;
    std::allocator<pstore::dump::object::member>::allocator(&local_152);
    __l._M_len = local_70;
    __l._M_array = local_78;
    std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
              (&local_68,__l,&local_152);
    dump::make_value((dump *)this,&local_68);
    std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::
    ~vector(&local_68);
    std::allocator<pstore::dump::object::member>::~allocator(&local_152);
    local_190 = (member *)&local_78;
    do {
      local_190 = local_190 + -1;
      dump::object::member::~member(local_190);
    } while (local_190 != &local_d8);
    std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_150);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::shared_ptr<pstore::dump::value>::~shared_ptr(&local_118);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    details::revision_restorer::~revision_restorer((revision_restorer *)local_40);
    vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (value_ptr)vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
  }
  assert_failed("new_revision >= old_revision",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/diff_dump/diff_value.hpp"
                ,0x9b);
}

Assistant:

dump::value_ptr make_index_diff (gsl::czstring const name, database & db,
                                         revision_number const new_revision,
                                         revision_number const old_revision,
                                         GetIndexFunction get_index) {
            PSTORE_ASSERT (new_revision >= old_revision);

            details::revision_restorer const _{db};
            db.sync (new_revision);

            return dump::make_value (dump::object::container{
                {"name", dump::make_value (name)},
                {"members", make_diff<Index> (db, old_revision, get_index)},
            });
        }